

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Constraint_Loop.cc
# Opt level: O1

void __thiscall
RigidBodyDynamics::LoopConstraint::calcConstraintJacobian
          (LoopConstraint *this,Model *model,double time,VectorNd *Q,VectorNd *QDot,
          MatrixNd *GSysUpd,ConstraintCache *cache,bool updateKinematics)

{
  double *pdVar1;
  uint uVar2;
  long lVar3;
  long lVar4;
  double dVar5;
  double *pdVar6;
  double *pdVar7;
  long lVar8;
  ActualDstType actualDst_1;
  ulong uVar9;
  double dVar10;
  long lVar11;
  ActualDstType actualDst;
  Matrix3d local_88;
  Matrix3d *local_40;
  pointer local_38;
  
  if (0 < *(long *)(cache + 0x300) * *(long *)(cache + 0x2f8)) {
    memset(*(void **)(cache + 0x2f0),0,*(long *)(cache + 0x300) * *(long *)(cache + 0x2f8) * 8);
  }
  if (0 < *(long *)(cache + 0x318) * *(long *)(cache + 0x310)) {
    memset(*(void **)(cache + 0x308),0,*(long *)(cache + 0x318) * *(long *)(cache + 0x310) * 8);
  }
  CalcPointJacobian6D(model,Q,*(this->super_Constraint).bodyIds.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_start,
                      &((this->super_Constraint).bodyFrames.
                        super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                        .
                        super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                        ._M_impl.super__Vector_impl_data._M_start)->r,(MatrixNd *)(cache + 0x2f0),
                      updateKinematics);
  CalcPointJacobian6D(model,Q,(this->super_Constraint).bodyIds.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start[1],
                      &(this->super_Constraint).bodyFrames.
                       super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                       .
                       super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                       ._M_impl.super__Vector_impl_data._M_start[1].r,(MatrixNd *)(cache + 0x308),
                      updateKinematics);
  lVar3 = *(long *)(cache + 0x308);
  lVar4 = *(long *)(cache + 0x2f0);
  lVar8 = *(long *)(cache + 0x300) * *(long *)(cache + 0x2f8);
  uVar9 = lVar8 - (lVar8 >> 0x3f) & 0xfffffffffffffffe;
  if (1 < lVar8) {
    lVar11 = 0;
    do {
      pdVar7 = (double *)(lVar3 + lVar11 * 8);
      dVar10 = pdVar7[1];
      pdVar6 = (double *)(lVar4 + lVar11 * 8);
      dVar5 = pdVar6[1];
      pdVar1 = (double *)(lVar4 + lVar11 * 8);
      *pdVar1 = *pdVar7 - *pdVar6;
      pdVar1[1] = dVar10 - dVar5;
      lVar11 = lVar11 + 2;
    } while (lVar11 < (long)uVar9);
  }
  if ((long)uVar9 < lVar8) {
    do {
      *(double *)(lVar4 + uVar9 * 8) =
           *(double *)(lVar3 + uVar9 * 8) - *(double *)(lVar4 + uVar9 * 8);
      uVar9 = uVar9 + 1;
    } while (lVar8 - uVar9 != 0);
  }
  CalcBodyToBaseCoordinates
            ((Vector3d *)&local_88,model,Q,
             *(this->super_Constraint).bodyIds.
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start,
             &((this->super_Constraint).bodyFrames.
               super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
               .
               super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
               ._M_impl.super__Vector_impl_data._M_start)->r,updateKinematics);
  *(double *)(cache + 0x4c8) =
       local_88.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
       m_storage.m_data.array[2];
  *(double *)(cache + 0x4b8) =
       local_88.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
       m_storage.m_data.array[0];
  *(double *)(cache + 0x4c0) =
       local_88.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
       m_storage.m_data.array[1];
  CalcBodyWorldOrientation
            (&local_88,model,Q,
             *(this->super_Constraint).bodyIds.
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start,updateKinematics);
  local_38 = (this->super_Constraint).bodyFrames.
             super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
             .
             super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
             ._M_impl.super__Vector_impl_data._M_start;
  local_40 = &local_88;
  Matrix3_t::operator=
            ((Matrix3_t *)(cache + 0x470),
             (MatrixBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
              *)&local_40);
  if ((this->super_Constraint).sizeOfConstraint != 0) {
    uVar9 = 0;
    do {
      Math::SpatialTransform::apply
                ((SpatialTransform *)(cache + 0x470),
                 (SpatialVector *)(uVar9 * 0x30 + *(long *)&(this->super_Constraint).field_0xd8));
      *(double *)(cache + 0x370) =
           local_88.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
           m_storage.m_data.array[4];
      *(double *)(cache + 0x378) =
           local_88.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
           m_storage.m_data.array[5];
      *(double *)(cache + 0x360) =
           local_88.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
           m_storage.m_data.array[2];
      *(double *)(cache + 0x368) =
           local_88.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
           m_storage.m_data.array[3];
      *(double *)(cache + 0x350) =
           local_88.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
           m_storage.m_data.array[0];
      *(double *)(cache + 0x358) =
           local_88.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
           m_storage.m_data.array[1];
      uVar2 = (this->super_Constraint).rowInSystem;
      pdVar7 = (GSysUpd->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage
               .m_data;
      lVar3 = (GSysUpd->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
              m_cols;
      local_88.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
      .m_data.array[0] = 0.0;
      local_88.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
      .m_data.array[1] = 0.0;
      if (*(long *)(cache + 0x300) != 0) {
        Eigen::PlainObjectBase<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>_>::resize
                  ((PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_> *)&local_88,1,
                   *(long *)(cache + 0x300));
      }
      if (local_88.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
          m_storage.m_data.array[1] != *(double *)(cache + 0x300)) {
        Eigen::PlainObjectBase<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>_>::resize
                  ((PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_> *)&local_88,1,
                   (Index)*(double *)(cache + 0x300));
      }
      if (0 < (long)local_88.super_Matrix3d.
                    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                    array[1]) {
        lVar4 = *(long *)(cache + 0x2f8);
        pdVar6 = (double *)(*(long *)(cache + 0x2f0) + 0x20);
        dVar10 = 0.0;
        do {
          *(double *)
           ((long)local_88.super_Matrix3d.
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                  array[0] + (long)dVar10 * 8) =
               pdVar6[1] * *(double *)(cache + 0x378) + pdVar6[-1] * *(double *)(cache + 0x368) +
               pdVar6[-3] * *(double *)(cache + 0x358) +
               *pdVar6 * *(double *)(cache + 0x370) + pdVar6[-2] * *(double *)(cache + 0x360) +
               pdVar6[-4] * *(double *)(cache + 0x350);
          dVar10 = (double)((long)dVar10 + 1);
          pdVar6 = pdVar6 + lVar4;
        } while (local_88.super_Matrix3d.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
                 [1] != dVar10);
      }
      if (0 < lVar3) {
        lVar4 = (GSysUpd->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                m_storage.m_rows;
        pdVar7 = pdVar7 + (uVar2 + (int)uVar9);
        lVar8 = 0;
        do {
          *pdVar7 = *(double *)
                     ((long)local_88.super_Matrix3d.
                            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                            m_data.array[0] + lVar8 * 8);
          lVar8 = lVar8 + 1;
          pdVar7 = pdVar7 + lVar4;
        } while (lVar3 != lVar8);
      }
      free((void *)local_88.super_Matrix3d.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                   array[0]);
      uVar9 = uVar9 + 1;
    } while (uVar9 < (this->super_Constraint).sizeOfConstraint);
  }
  return;
}

Assistant:

void LoopConstraint::calcConstraintJacobian( Model &model,
                              const double time,
                              const Math::VectorNd &Q,
                              const Math::VectorNd &QDot,
                              Math::MatrixNd &GSysUpd,
                              ConstraintCache &cache,
                              bool updateKinematics)
{
    //Please refer to Ch. 8 of Featherstone's Rigid Body Dynamics for details

    //Compute the spatial Jacobians of the predecessor point Gp and the
    //successor point Gs and evaluate Gs-Gp
    cache.mat6NA.setZero();
    cache.mat6NB.setZero();
    CalcPointJacobian6D(model,Q,bodyIds[0],bodyFrames[0].r,cache.mat6NA,
                        updateKinematics);
    CalcPointJacobian6D(model,Q,bodyIds[1],bodyFrames[1].r,cache.mat6NB,
                        updateKinematics);
    cache.mat6NA = cache.mat6NB-cache.mat6NA;

    //Evaluate the transform from the world frame into the constraint frame
    //that is attached to the precessor body
    cache.stA.r = CalcBodyToBaseCoordinates(model,Q,bodyIds[0],bodyFrames[0].r,
                                            updateKinematics);
    cache.stA.E = CalcBodyWorldOrientation(model,Q,bodyIds[0],updateKinematics
                                           ).transpose()*bodyFrames[0].E;

    for(unsigned int i=0; i<sizeOfConstraint;++i){
      //Resolve each constraint axis into the global frame
      cache.svecA =cache.stA.apply(T[i]);
      //Take the dot product of the constraint axis with Gs-Gp
      GSysUpd.block(rowInSystem+i,0,1,GSysUpd.cols())
          = cache.svecA.transpose()*cache.mat6NA;
    }

}